

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpticalFlowFrameToFrame.h
# Opt level: O2

bool __thiscall
vo::OpticalFlowFrameToFrame<float,_vo::Pattern51>::trackPointAtLevel
          (OpticalFlowFrameToFrame<float,_vo::Pattern51> *this,Image<const_unsigned_short> *img_2,
          PatchT *dp,AffineCompact2f *transform)

{
  PlainObjectBase<Eigen::Matrix<float,2,52,0,2,52>> *pPVar1;
  bool bVar2;
  uint uVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  PlainObjectBase<Eigen::Matrix<float,2,52,0,2,52>> *local_2f8 [2];
  DenseBase<Eigen::Product<Eigen::Block<Eigen::Matrix<float,_2,_3,_0,_2,_3>,_2,_2,_true>,_Eigen::Matrix<float,_2,_52,_0,_2,_52>,_0>_>
  *local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  Vector3 inc;
  SE2Base<Sophus::SE2<float,_0>_> local_2b8 [16];
  VectorP res;
  Matrix2P transformed_pat;
  
  pPVar1 = (PlainObjectBase<Eigen::Matrix<float,2,52,0,2,52>> *)
           ((transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
            m_storage.m_data.array + 4);
  bVar2 = true;
  for (uVar3 = 0;
      (res.super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>.m_storage.m_data.array[10]
            = 2.8026e-45,
      res.super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>.m_storage.m_data.array[0xb]
           = 0.0, bVar2 != false && (uVar3 < 5)); uVar3 = uVar3 + 1) {
    res.super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>.m_storage.m_data.array[6] =
         0.0;
    res.super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>.m_storage.m_data.array[7] =
         0.0;
    res.super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>.m_storage.m_data.array[8] =
         0.0;
    res.super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>.m_storage.m_data.array[9] =
         0.0;
    res.super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>.m_storage.m_data.array._48_8_
         = OpticalFlowPatch<float,vo::Pattern51<float>>::pattern2;
    res.super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>.m_storage.m_data.array._0_8_ =
         transform;
    res.super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>.m_storage.m_data.array._16_8_
         = transform;
    Eigen::PlainObjectBase<Eigen::Matrix<float,2,52,0,2,52>>::
    _set_noalias<Eigen::Product<Eigen::Block<Eigen::Matrix<float,2,3,0,2,3>,2,2,true>,Eigen::Matrix<float,2,52,0,2,52>,0>>
              ((PlainObjectBase<Eigen::Matrix<float,2,52,0,2,52>> *)&transformed_pat,
               (DenseBase<Eigen::Product<Eigen::Block<Eigen::Matrix<float,_2,_3,_0,_2,_3>,_2,_2,_true>,_Eigen::Matrix<float,_2,_52,_0,_2,_52>,_0>_>
                *)&res);
    res.super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>.m_storage.m_data.array[6] =
         0.0;
    res.super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>.m_storage.m_data.array[7] =
         0.0;
    res.super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>.m_storage.m_data.array[8] =
         2.8026e-45;
    res.super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>.m_storage.m_data.array[9] =
         0.0;
    res.super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>.m_storage.m_data.array[10] =
         2.8026e-45;
    res.super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>.m_storage.m_data.array[0xb] =
         0.0;
    local_2f8[0] = (PlainObjectBase<Eigen::Matrix<float,2,52,0,2,52>> *)&transformed_pat;
    res.super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>.m_storage.m_data.array._0_8_ =
         pPVar1;
    res.super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>.m_storage.m_data.array._16_8_
         = transform;
    Eigen::VectorwiseOp<Eigen::Matrix<float,2,52,0,2,52>,0>::operator+=
              ((VectorwiseOp<Eigen::Matrix<float,2,52,0,2,52>,0> *)local_2f8,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_2,_3,_0,_2,_3>,_2,_1,_true>_> *)&res);
    bVar2 = OpticalFlowPatch<float,_vo::Pattern51<float>_>::residual(dp,img_2,&transformed_pat,&res)
    ;
    if (bVar2) {
      local_2f8[0] = (PlainObjectBase<Eigen::Matrix<float,2,52,0,2,52>> *)&dp->H_se2_inv_J_se2_T;
      local_2e8 = (DenseBase<Eigen::Product<Eigen::Block<Eigen::Matrix<float,_2,_3,_0,_2,_3>,_2,_2,_true>,_Eigen::Matrix<float,_2,_52,_0,_2,_52>,_0>_>
                   *)&res;
      Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
      PlainObjectBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,52,0,3,52>const>,Eigen::Matrix<float,52,1,0,52,1>,0>>
                ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&inc,
                 (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_52,_0,_3,_52>_>,_Eigen::Matrix<float,_52,_1,_0,_52,_1>,_0>_>
                  *)local_2f8);
      Sophus::SE2Base<Sophus::SE2<float,_0>_>::exp
                (local_2b8,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      Sophus::SE2Base<Sophus::SE2<float,_0>_>::matrix((Transformation *)local_2f8,local_2b8);
      Eigen::Transform<float,2,18,0>::operator*=
                ((Transform<float,2,18,0> *)transform,
                 (EigenBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_2f8);
      local_2e0 = 0;
      local_2d8 = 2;
      local_2d0 = 2;
      local_2f8[0] = pPVar1;
      local_2e8 = (DenseBase<Eigen::Product<Eigen::Block<Eigen::Matrix<float,_2,_3,_0,_2,_3>,_2,_2,_true>,_Eigen::Matrix<float,_2,_52,_0,_2,_52>,_0>_>
                   *)transform;
      bVar2 = Image<unsigned_short_const>::
              InBounds<Eigen::Block<Eigen::Matrix<float,2,3,0,2,3>,2,1,true>>
                        (img_2,(MatrixBase<Eigen::Block<Eigen::Matrix<float,_2,_3,_0,_2,_3>,_2,_1,_true>_>
                                *)local_2f8,2.0);
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

inline bool trackPointAtLevel(const Image<const u_int16_t>& img_2,
                                const PatchT& dp,
                                Eigen::AffineCompact2f& transform) const {
    bool patch_valid = true;

    for (int iteration = 0;
         patch_valid && iteration < optical_flow_max_iterations; iteration++) {
      typename PatchT::VectorP res;

      typename PatchT::Matrix2P transformed_pat =
          transform.linear().matrix() * PatchT::pattern2;
      transformed_pat.colwise() += transform.translation();

      bool valid = dp.residual(img_2, transformed_pat, res);

      if (valid) {
        Vector3 inc = -dp.H_se2_inv_J_se2_T * res;
        transform *= SE2::exp(inc).matrix();

        const int filter_margin = 2;

        if (!img_2.InBounds(transform.translation(), filter_margin))
          patch_valid = false;
      } else {
        patch_valid = false;
      }
    }

    return patch_valid;
  }